

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O2

HighsStatus __thiscall Highs::postsolve(Highs *this,HighsSolution *solution)

{
  HighsStatus HVar1;
  HighsBasis basis;
  HighsBasis HStack_78;
  
  HighsBasis::HighsBasis(&HStack_78);
  HVar1 = postsolve(this,solution,&HStack_78);
  HighsBasis::~HighsBasis(&HStack_78);
  return HVar1;
}

Assistant:

HighsStatus Highs::postsolve(const HighsSolution& solution) {
  HighsBasis basis;
  return this->postsolve(solution, basis);
}